

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall
wabt::LoadStoreExpr<(wabt::ExprType)48>::LoadStoreExpr
          (LoadStoreExpr<(wabt::ExprType)48> *this,Opcode opcode,Var *memidx,Address align,
          Address offset,Location *loc)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  Var VStack_78;
  
  Var::Var(&VStack_78,memidx);
  (this->super_MemoryExpr<(wabt::ExprType)48>).super_ExprMixin<(wabt::ExprType)48>.super_Expr.
  super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  (this->super_MemoryExpr<(wabt::ExprType)48>).super_ExprMixin<(wabt::ExprType)48>.super_Expr.
  super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
  (this->super_MemoryExpr<(wabt::ExprType)48>).super_ExprMixin<(wabt::ExprType)48>.super_Expr.
  _vptr_Expr = (_func_int **)&PTR__Expr_002435d8;
  pcVar1 = (loc->filename)._M_str;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->super_MemoryExpr<(wabt::ExprType)48>).super_ExprMixin<(wabt::ExprType)48>.super_Expr.loc.
  filename._M_len = (loc->filename)._M_len;
  (this->super_MemoryExpr<(wabt::ExprType)48>).super_ExprMixin<(wabt::ExprType)48>.super_Expr.loc.
  filename._M_str = pcVar1;
  (this->super_MemoryExpr<(wabt::ExprType)48>).super_ExprMixin<(wabt::ExprType)48>.super_Expr.loc.
  field_1.field_1.offset = sVar2;
  *(undefined8 *)
   ((long)&(this->super_MemoryExpr<(wabt::ExprType)48>).super_ExprMixin<(wabt::ExprType)48>.
           super_Expr.loc.field_1 + 8) = uVar3;
  (this->super_MemoryExpr<(wabt::ExprType)48>).super_ExprMixin<(wabt::ExprType)48>.super_Expr.type_
       = LoadZero;
  (this->super_MemoryExpr<(wabt::ExprType)48>).super_ExprMixin<(wabt::ExprType)48>.super_Expr.
  _vptr_Expr = (_func_int **)&PTR__MemoryExpr_00246ca0;
  Var::Var(&(this->super_MemoryExpr<(wabt::ExprType)48>).memidx,&VStack_78);
  Var::~Var(&VStack_78);
  (this->super_MemoryExpr<(wabt::ExprType)48>).super_ExprMixin<(wabt::ExprType)48>.super_Expr.
  _vptr_Expr = (_func_int **)&PTR__MemoryExpr_00246c38;
  (this->opcode).enum_ = opcode.enum_;
  this->align = align;
  this->offset = offset;
  return;
}

Assistant:

LoadStoreExpr(Opcode opcode,
                Var memidx,
                Address align,
                Address offset,
                const Location& loc = Location())
      : MemoryExpr<TypeEnum>(memidx, loc),
        opcode(opcode),
        align(align),
        offset(offset) {}